

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O2

void re2c::need(OutputFile *o,uint32_t ind,bool *readCh,size_t n,bool bSetMarker)

{
  uint32_t n_00;
  bool *pbVar1;
  opt_t *poVar2;
  OutputFile *pOVar3;
  size_t need;
  uint32_t local_84;
  string local_80;
  OutputFile *local_60;
  bool *local_58;
  string local_50;
  
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  n_00 = last_fill_index;
  if (poVar2->target != DOT) {
    local_58 = readCh;
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar2->fFlag == true) {
      last_fill_index = last_fill_index + 1;
      local_84 = n_00;
      pOVar3 = OutputFile::wind(o,ind);
      poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      std::__cxx11::string::string((string *)&local_50,(string *)&poVar2->state_set);
      poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      replaceParam<unsigned_int>(&local_80,&local_50,&poVar2->state_set_arg,&local_84);
      OutputFile::wstring(pOVar3,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_50);
      poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if (poVar2->state_set_naked == false) {
        pOVar3 = OutputFile::ws(o,"(");
        pOVar3 = OutputFile::wu32(pOVar3,local_84);
        OutputFile::ws(pOVar3,");");
      }
      OutputFile::ws(o,"\n");
    }
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if ((n != 0) && (poVar2->fill_use != false)) {
      OutputFile::wind(o,ind);
      poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if (n == 1) {
        need = 1;
        if (poVar2->fill_check != false) {
          local_60 = OutputFile::ws(o,"if (");
          poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
          InputAPI::expr_lessthan_one_abi_cxx11_(&local_80,&poVar2->input_api);
          pOVar3 = OutputFile::wstring(local_60,&local_80);
          OutputFile::ws(pOVar3,") ");
          std::__cxx11::string::~string((string *)&local_80);
        }
      }
      else {
        need = n;
        if (poVar2->fill_check != false) {
          pOVar3 = OutputFile::ws(o,"if (");
          poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
          InputAPI::expr_lessthan_abi_cxx11_(&local_80,&poVar2->input_api,n);
          pOVar3 = OutputFile::wstring(pOVar3,&local_80);
          OutputFile::ws(pOVar3,") ");
          std::__cxx11::string::~string((string *)&local_80);
        }
      }
      genYYFill(o,need);
    }
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar2->fFlag == true) {
      poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      pOVar3 = OutputFile::wstring(o,&poVar2->yyfilllabel);
      pOVar3 = OutputFile::wu32(pOVar3,n_00);
      OutputFile::ws(pOVar3,":\n");
    }
    pbVar1 = local_58;
    if (n != 0) {
      if (bSetMarker) {
        poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        InputAPI::stmt_backup_peek_abi_cxx11_(&local_80,&poVar2->input_api,ind);
        OutputFile::wstring(o,&local_80);
      }
      else {
        poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        InputAPI::stmt_peek_abi_cxx11_(&local_80,&poVar2->input_api,ind);
        OutputFile::wstring(o,&local_80);
      }
      std::__cxx11::string::~string((string *)&local_80);
      *pbVar1 = false;
    }
  }
  return;
}

Assistant:

void need (OutputFile & o, uint32_t ind, bool & readCh, size_t n, bool bSetMarker)
{
	if (opts->target == opt_t::DOT)
	{
		return;
	}

	uint32_t fillIndex = last_fill_index;

	if (opts->fFlag)
	{
		last_fill_index++;
		genSetState (o, ind, fillIndex);
	}

	if (opts->fill_use && n > 0)
	{
		o.wind(ind);
		if (n == 1)
		{
			if (opts->fill_check)
			{
				o.ws("if (").wstring(opts->input_api.expr_lessthan_one ()).ws(") ");
			}
			genYYFill(o, n);
		}
		else
		{
			if (opts->fill_check)
			{
				o.ws("if (").wstring(opts->input_api.expr_lessthan (n)).ws(") ");
			}
			genYYFill(o, n);
		}
	}

	if (opts->fFlag)
	{
		o.wstring(opts->yyfilllabel).wu32(fillIndex).ws(":\n");
	}

	if (n > 0)
	{
		if (bSetMarker)
		{
			o.wstring(opts->input_api.stmt_backup_peek (ind));
		}
		else
		{
			o.wstring(opts->input_api.stmt_peek (ind));
		}
		readCh = false;
	}
}